

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

pair<bool,_cmValue> __thiscall
anon_unknown.dwarf_68c3e0::FileSetType::ReadProperties
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  undefined8 uVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  string_view str;
  string_view str_00;
  pair<bool,_cmValue> pVar4;
  string_view separator;
  string_view separator_00;
  allocator<char> local_49;
  string fileSetName;
  
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  bVar1 = std::operator==(__x,(this->DefaultDirectoryProperty).super_string_view);
  if (bVar1) {
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&fileSetName,&this->TypeName,&local_49);
    this_00 = (string *)
              cmTargetInternals::GetFileSetDirectories
                        (impl,tgt,&fileSetName,(this->TypeName).super_string_view);
  }
  else {
    __x_00._M_str = (prop->_M_dataplus)._M_p;
    __x_00._M_len = prop->_M_string_length;
    bVar1 = std::operator==(__x_00,(this->DefaultPathProperty).super_string_view);
    if (bVar1) {
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&fileSetName,&this->TypeName,&local_49);
      this_00 = (string *)
                cmTargetInternals::GetFileSetPaths
                          (impl,tgt,&fileSetName,(this->TypeName).super_string_view);
    }
    else {
      __x_01._M_str = (prop->_M_dataplus)._M_p;
      __x_01._M_len = prop->_M_string_length;
      bVar1 = std::operator==(__x_01,(this->SelfEntries).PropertyName.super_string_view);
      if (bVar1) {
        if (((anonymous_namespace)::FileSetType::
             ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
             output_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                         ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                         ::output_abi_cxx11_), iVar2 != 0)) {
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&(anonymous_namespace)::FileSetType::
                         ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                         ::output_abi_cxx11_.field_2;
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_._M_string_length = 0;
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
          __cxa_atexit(std::__cxx11::string::~string,
                       &(anonymous_namespace)::FileSetType::
                        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                        ::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                               ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                               ::output_abi_cxx11_);
        }
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&fileSetName,&(this->SelfEntries).Entries,separator);
        this_00 = &(anonymous_namespace)::FileSetType::
                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                   ::output_abi_cxx11_;
      }
      else {
        __x_02._M_str = (prop->_M_dataplus)._M_p;
        __x_02._M_len = prop->_M_string_length;
        bVar1 = std::operator==(__x_02,(this->InterfaceEntries).PropertyName.super_string_view);
        if (!bVar1) {
          str._M_str = (prop->_M_dataplus)._M_p;
          str._M_len = prop->_M_string_length;
          bVar1 = cmHasPrefix(str,(this->DirectoryPrefix).super_string_view);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
            if (fileSetName._M_string_length == 0) {
LAB_00233f18:
              this_00 = (string *)0x0;
            }
            else {
              this_00 = (string *)
                        cmTargetInternals::GetFileSetDirectories
                                  (impl,tgt,&fileSetName,(this->TypeName).super_string_view);
            }
          }
          else {
            str_00._M_str = (prop->_M_dataplus)._M_p;
            str_00._M_len = prop->_M_string_length;
            bVar1 = cmHasPrefix(str_00,(this->PathPrefix).super_string_view);
            if (!bVar1) {
              this_00 = (string *)0x0;
              uVar3 = 0;
              goto LAB_00233d9e;
            }
            std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
            if (fileSetName._M_string_length == 0) goto LAB_00233f18;
            this_00 = (string *)
                      cmTargetInternals::GetFileSetPaths
                                (impl,tgt,&fileSetName,(this->TypeName).super_string_view);
          }
          goto LAB_00233d97;
        }
        if (((anonymous_namespace)::FileSetType::
             ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
             output_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                         ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                         ::output_abi_cxx11_), iVar2 != 0)) {
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&(anonymous_namespace)::FileSetType::
                         ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                         ::output_abi_cxx11_.field_2;
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_._M_string_length = 0;
          (anonymous_namespace)::FileSetType::
          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
          output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
          __cxa_atexit(std::__cxx11::string::~string,
                       &(anonymous_namespace)::FileSetType::
                        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                        ::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                               ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                               ::output_abi_cxx11_);
        }
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&fileSetName,&(this->InterfaceEntries).Entries,separator_00);
        this_00 = &(anonymous_namespace)::FileSetType::
                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                   ::output_abi_cxx11_;
      }
      std::__cxx11::string::operator=((string *)this_00,(string *)&fileSetName);
    }
  }
LAB_00233d97:
  uVar3 = std::__cxx11::string::~string((string *)&fileSetName);
  uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
LAB_00233d9e:
  pVar4.second.Value = this_00;
  pVar4._0_8_ = uVar3;
  return pVar4;
}

Assistant:

std::pair<bool, cmValue> FileSetType::ReadProperties(
  cmTarget const* tgt, cmTargetInternals const* impl,
  const std::string& prop) const
{
  bool did_read = false;
  cmValue value = nullptr;
  if (prop == this->DefaultDirectoryProperty) {
    value = impl->GetFileSetDirectories(tgt, std::string(this->TypeName),
                                        this->TypeName);
    did_read = true;
  } else if (prop == this->DefaultPathProperty) {
    value =
      impl->GetFileSetPaths(tgt, std::string(this->TypeName), this->TypeName);
    did_read = true;
  } else if (prop == this->SelfEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->SelfEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (prop == this->InterfaceEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->InterfaceEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    std::string fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetDirectories(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  } else if (cmHasPrefix(prop, this->PathPrefix)) {
    std::string fileSetName = prop.substr(this->PathPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetPaths(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  }
  return { did_read, value };
}